

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int pushmode(lua_State *L,int oldmode)

{
  char *s;
  int oldmode_local;
  lua_State *L_local;
  
  if (oldmode == -1) {
    lua_pushnil(L);
  }
  else {
    s = "generational";
    if (oldmode == 0xb) {
      s = "incremental";
    }
    lua_pushstring(L,s);
  }
  return 1;
}

Assistant:

static int pushmode (lua_State *L, int oldmode) {
  if (oldmode == -1)
    luaL_pushfail(L);  /* invalid call to 'lua_gc' */
  else
    lua_pushstring(L, (oldmode == LUA_GCINC) ? "incremental"
                                             : "generational");
  return 1;
}